

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void RGB565ToARGBRow_C(uint8_t *src_rgb565,uint8_t *dst_argb,int width)

{
  byte bVar1;
  byte bVar2;
  uint8_t r;
  uint8_t g;
  uint8_t b;
  int x;
  int width_local;
  uint8_t *dst_argb_local;
  uint8_t *src_rgb565_local;
  
  dst_argb_local = dst_argb;
  src_rgb565_local = src_rgb565;
  for (x = 0; x < width; x = x + 1) {
    bVar2 = (byte)((int)(uint)*src_rgb565_local >> 5) | (src_rgb565_local[1] & 7) << 3;
    bVar1 = src_rgb565_local[1];
    *dst_argb_local =
         (*src_rgb565_local & 0x1f) << 3 | (byte)((int)(uint)(*src_rgb565_local & 0x1f) >> 2);
    dst_argb_local[1] = bVar2 << 2 | (byte)((int)(uint)bVar2 >> 4);
    dst_argb_local[2] = (char)((int)(uint)bVar1 >> 3) << 3 | (byte)((int)(uint)bVar1 >> 5);
    dst_argb_local[3] = 0xff;
    dst_argb_local = dst_argb_local + 4;
    src_rgb565_local = src_rgb565_local + 2;
  }
  return;
}

Assistant:

void RGB565ToARGBRow_C(const uint8_t* src_rgb565,
                       uint8_t* dst_argb,
                       int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t b = src_rgb565[0] & 0x1f;
    uint8_t g = (src_rgb565[0] >> 5) | ((src_rgb565[1] & 0x07) << 3);
    uint8_t r = src_rgb565[1] >> 3;
    dst_argb[0] = (b << 3) | (b >> 2);
    dst_argb[1] = (g << 2) | (g >> 4);
    dst_argb[2] = (r << 3) | (r >> 2);
    dst_argb[3] = 255u;
    dst_argb += 4;
    src_rgb565 += 2;
  }
}